

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_maps.cpp
# Opt level: O0

int (anonymous_namespace)::
    bench<poplar::map<poplar::compact_bonsai_trie<90u,4u,poplar::compact_hash_table<7u,80u,poplar::bijective_hash::split_mix_hasher>,poplar::standard_hash_table<80u,poplar::hash::vigna_hasher>,poplar::bijective_hash::split_mix_hasher>,poplar::compact_bonsai_nlm<int,16ul>>>
              (parser *p)

{
  uint uVar1;
  unsigned_long uVar2;
  byte bVar3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  uint *puVar6;
  unsigned_long *puVar7;
  int *piVar8;
  bool *pbVar9;
  istream *piVar10;
  value_type *pvVar11;
  size_t sVar12;
  ostream *poVar13;
  element_type *peVar14;
  size_type sVar15;
  reference pvVar16;
  double dVar17;
  undefined1 auVar18 [64];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined1 auVar19 [16];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 auVar20 [64];
  undefined1 extraout_var_02 [56];
  string indent;
  ostream *out;
  value_type *ptr;
  string *query;
  iterator __end4_1;
  iterator __begin4_1;
  element_type *__range4_1;
  timer t_1;
  size_t _ng;
  size_t _ok;
  string *key_1;
  iterator __end4;
  iterator __begin4;
  element_type *__range4;
  timer t;
  __single_object map_1;
  int i;
  vector<double,_std::allocator<double>_> search_times;
  vector<double,_std::allocator<double>_> insert_times;
  string line_1;
  ifstream ifs_2;
  string line;
  ifstream ifs_1;
  shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  queries;
  shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  keys;
  string key;
  ifstream ifs;
  __single_object map;
  double best_search_us_per_query;
  double best_insert_us_per_key;
  double search_us_per_query;
  double insert_us_per_key;
  uint64_t process_size;
  uint64_t ng;
  uint64_t ok;
  uint64_t num_queries;
  uint64_t num_keys;
  bool detail;
  int runs;
  unsigned_long lambda;
  uint capa_bits;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> query_fn;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> key_fn;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff500;
  string *in_stack_fffffffffffff508;
  map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
  *in_stack_fffffffffffff510;
  size_type in_stack_fffffffffffff518;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff520;
  uint *in_stack_fffffffffffff528;
  int n;
  allocator<char> *in_stack_fffffffffffff530;
  char *in_stack_fffffffffffff538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff540;
  ostream *in_stack_fffffffffffff560;
  int iVar21;
  ostream *in_stack_fffffffffffff568;
  undefined6 in_stack_fffffffffffff570;
  byte in_stack_fffffffffffff576;
  undefined1 in_stack_fffffffffffff577;
  string *in_stack_fffffffffffff5a8;
  parser *in_stack_fffffffffffff5b0;
  string local_960 [32];
  string local_940 [32];
  undefined8 *local_920;
  map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
  *local_918;
  reference local_910;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_908;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_900;
  element_type *local_8f8;
  long local_8e8;
  long local_8e0;
  reference local_8d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8d0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_8c8;
  element_type *local_8c0;
  int local_8a8;
  vector<double,_std::allocator<double>_> local_8a0;
  vector<double,_std::allocator<double>_> local_880;
  string local_868 [48];
  long local_838 [65];
  string local_630 [48];
  long local_600 [69];
  string local_3d8 [36];
  int local_3b4;
  long local_3b0 [66];
  double local_1a0;
  double local_198;
  double local_190;
  double local_188;
  size_t local_180;
  long local_178;
  long local_170;
  size_type local_168;
  size_type local_160;
  allocator<char> local_151;
  string local_150 [38];
  byte local_12a;
  allocator<char> local_129;
  string local_128 [32];
  int local_108;
  allocator<char> local_101;
  string local_100 [32];
  unsigned_long local_e0;
  allocator<char> local_d1;
  string local_d0 [32];
  uint local_b0;
  allocator<char> local_a9;
  string local_a8 [32];
  string local_88 [55];
  allocator<char> local_51;
  string local_50 [32];
  string local_30 [44];
  int local_4;
  undefined1 extraout_var [56];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff540,in_stack_fffffffffffff538,in_stack_fffffffffffff530);
  pbVar5 = cmdline::parser::get<std::__cxx11::string>
                     (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
  std::__cxx11::string::string(local_30,(string *)pbVar5);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff540,in_stack_fffffffffffff538,in_stack_fffffffffffff530);
  pbVar5 = cmdline::parser::get<std::__cxx11::string>
                     (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
  std::__cxx11::string::string(local_88,(string *)pbVar5);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff540,in_stack_fffffffffffff538,in_stack_fffffffffffff530);
  puVar6 = cmdline::parser::get<unsigned_int>(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
  uVar1 = *puVar6;
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  local_b0 = uVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff540,in_stack_fffffffffffff538,in_stack_fffffffffffff530);
  puVar7 = cmdline::parser::get<unsigned_long>(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
  uVar2 = *puVar7;
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  local_e0 = uVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff540,in_stack_fffffffffffff538,in_stack_fffffffffffff530);
  piVar8 = cmdline::parser::get<int>(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
  iVar21 = *piVar8;
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  local_108 = iVar21;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff540,in_stack_fffffffffffff538,in_stack_fffffffffffff530);
  pbVar9 = cmdline::parser::get<bool>(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
  bVar4 = *pbVar9;
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator(&local_151);
  local_12a = bVar4 & 1;
  local_160 = 0;
  local_168 = 0;
  local_170 = 0;
  local_178 = 0;
  local_180 = poplar::get_process_size();
  local_188 = 0.0;
  local_190 = 0.0;
  local_198 = 0.0;
  local_1a0 = 0.0;
  std::
  make_unique<poplar::map<poplar::compact_bonsai_trie<90u,4u,poplar::compact_hash_table<7u,80u,poplar::bijective_hash::split_mix_hasher>,poplar::standard_hash_table<80u,poplar::hash::vigna_hasher>,poplar::bijective_hash::split_mix_hasher>,poplar::compact_bonsai_nlm<int,16ul>>,unsigned_int&,unsigned_long&>
            (in_stack_fffffffffffff528,(unsigned_long *)in_stack_fffffffffffff520);
  std::ifstream::ifstream(local_3b0,local_30,8);
  bVar3 = std::ios::operator!((ios *)((long)local_3b0 + *(long *)(local_3b0[0] + -0x18)));
  if ((bVar3 & 1) == 0) {
    std::__cxx11::string::string(local_3d8);
    std::__cxx11::string::reserve((ulong)local_3d8);
    while( true ) {
      piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)local_3b0,local_3d8);
      bVar4 = std::ios::operator_cast_to_bool
                        ((ios *)(piVar10 + *(long *)(*(long *)piVar10 + -0x18)));
      if (!bVar4) break;
      std::
      unique_ptr<poplar::map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>,_std::default_delete<poplar::map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>_>_>
      ::operator->((unique_ptr<poplar::map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>,_std::default_delete<poplar::map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>_>_>
                    *)0x1b0eb5);
      pvVar11 = poplar::
                map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
                ::update(in_stack_fffffffffffff510,in_stack_fffffffffffff508);
      *pvVar11 = 1;
      local_160 = local_160 + 1;
    }
    sVar12 = poplar::get_process_size();
    local_180 = sVar12 - local_180;
    std::__cxx11::string::~string(local_3d8);
    local_3b4 = 0;
  }
  else {
    poVar13 = std::operator<<((ostream *)&std::cerr,"error: failed to open ");
    poVar13 = std::operator<<(poVar13,local_30);
    std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
    local_4 = 1;
    local_3b4 = 1;
  }
  std::ifstream::~ifstream(local_3b0);
  if (local_3b4 != 0) goto LAB_001b1d2e;
  std::
  shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::shared_ptr((shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)0x1b0f86);
  std::
  shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::shared_ptr((shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)0x1b0f93);
  std::ifstream::ifstream(local_600,local_30,8);
  bVar3 = std::ios::operator!((ios *)((long)local_600 + *(long *)(local_600[0] + -0x18)));
  if ((bVar3 & 1) == 0) {
    std::make_shared<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
    std::
    shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=((shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffff500,
                (shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffff4f8);
    std::
    shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~shared_ptr((shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x1b10d3);
    std::
    __shared_ptr_access<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1b10e0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff530,(size_type)in_stack_fffffffffffff528);
    std::__cxx11::string::string(local_630);
    while( true ) {
      piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)local_600,local_630);
      in_stack_fffffffffffff577 =
           std::ios::operator_cast_to_bool((ios *)(piVar10 + *(long *)(*(long *)piVar10 + -0x18)));
      if (!(bool)in_stack_fffffffffffff577) break;
      std::
      __shared_ptr_access<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1b1192);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff510,in_stack_fffffffffffff508);
    }
    local_3b4 = 4;
    std::__cxx11::string::~string(local_630);
    local_3b4 = 0;
  }
  else {
    poVar13 = std::operator<<((ostream *)&std::cerr,"Error: failed to open ");
    poVar13 = std::operator<<(poVar13,local_30);
    std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
    local_4 = 1;
    local_3b4 = 1;
  }
  std::ifstream::~ifstream(local_600);
  auVar20._8_56_ = extraout_var_00;
  auVar20._0_8_ = extraout_XMM1_Qa;
  if (local_3b4 == 0) {
    bVar4 = std::operator!=(in_stack_fffffffffffff500,(char *)in_stack_fffffffffffff4f8);
    if (bVar4) {
      std::ifstream::ifstream(local_838,local_88,8);
      in_stack_fffffffffffff576 =
           std::ios::operator!((ios *)((long)local_838 + *(long *)(local_838[0] + -0x18)));
      if ((in_stack_fffffffffffff576 & 1) == 0) {
        std::make_shared<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
        std::
        shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator=((shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffff500,
                    (shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffff4f8);
        std::
        shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~shared_ptr((shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)0x1b12f4);
        std::__cxx11::string::string(local_868);
        while( true ) {
          piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)local_838,local_868);
          bVar4 = std::ios::operator_cast_to_bool
                            ((ios *)(piVar10 + *(long *)(*(long *)piVar10 + -0x18)));
          if (!bVar4) break;
          std::
          __shared_ptr_access<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1b138b);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff510,in_stack_fffffffffffff508);
        }
        local_3b4 = 6;
        std::__cxx11::string::~string(local_868);
        std::
        __shared_ptr_access<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1b13af);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::shrink_to_fit((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)0x1b13b7);
        local_3b4 = 0;
      }
      else {
        in_stack_fffffffffffff568 = std::operator<<((ostream *)&std::cerr,"Error: failed to open ");
        in_stack_fffffffffffff560 = std::operator<<(in_stack_fffffffffffff568,local_88);
        std::ostream::operator<<(in_stack_fffffffffffff560,std::endl<char,std::char_traits<char>>);
        local_4 = 1;
        local_3b4 = 1;
      }
      std::ifstream::~ifstream(local_838);
      auVar20._8_56_ = extraout_var_01;
      auVar20._0_8_ = extraout_XMM1_Qa_00;
      if (local_3b4 != 0) goto LAB_001b1cf6;
    }
    else {
      std::
      shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator=((shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffff500,
                  (shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffff4f8);
    }
    std::allocator<double>::allocator((allocator<double> *)0x1b142a);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffff520,in_stack_fffffffffffff518,
               (allocator_type *)in_stack_fffffffffffff510);
    std::allocator<double>::~allocator((allocator<double> *)0x1b1450);
    std::allocator<double>::allocator((allocator<double> *)0x1b146f);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffff520,in_stack_fffffffffffff518,
               (allocator_type *)in_stack_fffffffffffff510);
    std::allocator<double>::~allocator((allocator<double> *)0x1b1495);
    for (local_8a8 = 0; iVar21 = (int)((ulong)in_stack_fffffffffffff560 >> 0x20),
        local_8a8 < local_108; local_8a8 = local_8a8 + 1) {
      std::
      make_unique<poplar::map<poplar::compact_bonsai_trie<90u,4u,poplar::compact_hash_table<7u,80u,poplar::bijective_hash::split_mix_hasher>,poplar::standard_hash_table<80u,poplar::hash::vigna_hasher>,poplar::bijective_hash::split_mix_hasher>,poplar::compact_bonsai_nlm<int,16ul>>,unsigned_int&,unsigned_long&>
                (in_stack_fffffffffffff528,(unsigned_long *)in_stack_fffffffffffff520);
      poplar::timer::timer((timer *)in_stack_fffffffffffff500);
      local_8c0 = std::
                  __shared_ptr_access<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator*((__shared_ptr_access<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)in_stack_fffffffffffff500);
      local_8c8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(in_stack_fffffffffffff4f8);
      local_8d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff4f8);
      while( true ) {
        bVar4 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffff500,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffff4f8);
        auVar19 = auVar20._0_16_;
        if (!bVar4) break;
        local_8d8 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_8c8);
        std::
        unique_ptr<poplar::map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>,_std::default_delete<poplar::map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>_>_>
        ::operator->((unique_ptr<poplar::map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>,_std::default_delete<poplar::map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>_>_>
                      *)0x1b155f);
        in_stack_fffffffffffff528 =
             (uint *)poplar::
                     map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
                     ::update(in_stack_fffffffffffff510,in_stack_fffffffffffff508);
        *in_stack_fffffffffffff528 = 1;
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_8c8);
      }
      in_stack_fffffffffffff520 =
           (vector<double,_std::allocator<double>_> *)
           poplar::timer::get<std::ratio<1l,1000000l>>((timer *)in_stack_fffffffffffff510);
      peVar14 = std::
                __shared_ptr_access<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1b163d);
      sVar15 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(peVar14);
      auVar19 = vcvtusi2sd_avx512f(auVar19,sVar15);
      auVar20 = ZEXT1664(auVar19);
      dVar17 = (double)in_stack_fffffffffffff520 / auVar19._0_8_;
      pvVar16 = std::vector<double,_std::allocator<double>_>::operator[](&local_880,(long)local_8a8)
      ;
      *pvVar16 = dVar17;
      local_8e0 = 0;
      local_8e8 = 0;
      poplar::timer::timer((timer *)in_stack_fffffffffffff500);
      local_8f8 = std::
                  __shared_ptr_access<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator*((__shared_ptr_access<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)in_stack_fffffffffffff500);
      local_900._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(in_stack_fffffffffffff4f8);
      local_908 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff4f8);
      while( true ) {
        bVar4 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffff500,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffff4f8);
        auVar19 = auVar20._0_16_;
        if (!bVar4) break;
        local_910 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_900);
        std::
        unique_ptr<poplar::map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>,_std::default_delete<poplar::map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>_>_>
        ::operator->((unique_ptr<poplar::map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>,_std::default_delete<poplar::map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>_>_>
                      *)0x1b171e);
        in_stack_fffffffffffff510 =
             (map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
              *)poplar::
                map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
                ::find(in_stack_fffffffffffff510,in_stack_fffffffffffff508);
        if ((in_stack_fffffffffffff510 ==
             (map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
              *)0x0) || (*(int *)in_stack_fffffffffffff510 != 1)) {
          local_8e8 = local_8e8 + 1;
        }
        else {
          local_8e0 = local_8e0 + 1;
        }
        local_918 = in_stack_fffffffffffff510;
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_900);
      }
      in_stack_fffffffffffff508 =
           (string *)poplar::timer::get<std::ratio<1l,1000000l>>((timer *)in_stack_fffffffffffff510)
      ;
      peVar14 = std::
                __shared_ptr_access<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1b17ba);
      sVar15 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(peVar14);
      auVar19 = vcvtusi2sd_avx512f(auVar19,sVar15);
      auVar20 = ZEXT1664(auVar19);
      in_stack_fffffffffffff500 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((double)in_stack_fffffffffffff508 / auVar19._0_8_);
      pvVar16 = std::vector<double,_std::allocator<double>_>::operator[](&local_8a0,(long)local_8a8)
      ;
      *pvVar16 = (value_type)in_stack_fffffffffffff500;
      if ((local_8a8 == 0) || ((local_170 == local_8e0 && (local_178 == local_8e8)))) {
        local_170 = local_8e0;
        local_178 = local_8e8;
        local_3b4 = 0;
      }
      else {
        in_stack_fffffffffffff4f8 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::operator<<((ostream *)&std::cerr,"critical error for search results");
        std::ostream::operator<<(in_stack_fffffffffffff4f8,std::endl<char,std::char_traits<char>>);
        auVar20._8_56_ = extraout_var_02;
        auVar20._0_8_ = extraout_XMM1_Qa_01;
        local_4 = 1;
        local_3b4 = 1;
      }
      std::
      unique_ptr<poplar::map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>,_std::default_delete<poplar::map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>_>_>
      ::~unique_ptr((unique_ptr<poplar::map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>,_std::default_delete<poplar::map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>_>_>
                     *)in_stack_fffffffffffff500);
      iVar21 = (int)((ulong)in_stack_fffffffffffff560 >> 0x20);
      if (local_3b4 != 0) goto LAB_001b1968;
    }
    peVar14 = std::
              __shared_ptr_access<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1b18d8);
    local_160 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(peVar14);
    peVar14 = std::
              __shared_ptr_access<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1b18f5);
    local_168 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(peVar14);
    local_188 = anon_unknown.dwarf_4722b::get_average(in_stack_fffffffffffff520);
    local_198 = anon_unknown.dwarf_4722b::get_min(in_stack_fffffffffffff520);
    local_190 = anon_unknown.dwarf_4722b::get_average(in_stack_fffffffffffff520);
    local_1a0 = anon_unknown.dwarf_4722b::get_min(in_stack_fffffffffffff520);
    local_3b4 = 0;
LAB_001b1968:
    n = (int)((ulong)in_stack_fffffffffffff528 >> 0x20);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff510);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff510);
    if (local_3b4 == 0) {
      local_920 = &std::cout;
      poplar::get_indent_abi_cxx11_(n);
      poplar::
      short_realname<poplar::map<poplar::compact_bonsai_trie<90u,4u,poplar::compact_hash_table<7u,80u,poplar::bijective_hash::split_mix_hasher>,poplar::standard_hash_table<80u,poplar::hash::vigna_hasher>,poplar::bijective_hash::split_mix_hasher>,poplar::compact_bonsai_nlm<int,16ul>>>
                ();
      poplar::show_stat<std::__cxx11::string>
                ((ostream *)in_stack_fffffffffffff510,in_stack_fffffffffffff508,
                 (char *)in_stack_fffffffffffff500,in_stack_fffffffffffff4f8);
      auVar18._0_8_ = std::__cxx11::string::~string(local_960);
      auVar18._8_56_ = extraout_var;
      auVar19 = auVar18._0_16_;
      poplar::show_stat<std::__cxx11::string>
                ((ostream *)in_stack_fffffffffffff510,in_stack_fffffffffffff508,
                 (char *)in_stack_fffffffffffff500,in_stack_fffffffffffff4f8);
      poplar::show_stat<std::__cxx11::string>
                ((ostream *)in_stack_fffffffffffff510,in_stack_fffffffffffff508,
                 (char *)in_stack_fffffffffffff500,in_stack_fffffffffffff4f8);
      poplar::show_stat<unsigned_int>
                ((ostream *)in_stack_fffffffffffff510,in_stack_fffffffffffff508,
                 (char *)in_stack_fffffffffffff500,(uint *)in_stack_fffffffffffff4f8);
      poplar::show_stat<unsigned_long>
                ((ostream *)in_stack_fffffffffffff510,in_stack_fffffffffffff508,
                 (char *)in_stack_fffffffffffff500,(unsigned_long *)in_stack_fffffffffffff4f8);
      vcvtusi2sd_avx512f(auVar19,local_180);
      poplar::show_stat<double>
                ((ostream *)in_stack_fffffffffffff510,in_stack_fffffffffffff508,
                 (char *)in_stack_fffffffffffff500,(double *)in_stack_fffffffffffff4f8);
      poplar::show_stat<unsigned_long>
                ((ostream *)in_stack_fffffffffffff510,in_stack_fffffffffffff508,
                 (char *)in_stack_fffffffffffff500,(unsigned_long *)in_stack_fffffffffffff4f8);
      poplar::show_stat<unsigned_long>
                ((ostream *)in_stack_fffffffffffff510,in_stack_fffffffffffff508,
                 (char *)in_stack_fffffffffffff500,(unsigned_long *)in_stack_fffffffffffff4f8);
      poplar::show_stat<int>
                ((ostream *)in_stack_fffffffffffff510,in_stack_fffffffffffff508,
                 (char *)in_stack_fffffffffffff500,(int *)in_stack_fffffffffffff4f8);
      poplar::show_stat<double>
                ((ostream *)in_stack_fffffffffffff510,in_stack_fffffffffffff508,
                 (char *)in_stack_fffffffffffff500,(double *)in_stack_fffffffffffff4f8);
      poplar::show_stat<double>
                ((ostream *)in_stack_fffffffffffff510,in_stack_fffffffffffff508,
                 (char *)in_stack_fffffffffffff500,(double *)in_stack_fffffffffffff4f8);
      poplar::show_stat<double>
                ((ostream *)in_stack_fffffffffffff510,in_stack_fffffffffffff508,
                 (char *)in_stack_fffffffffffff500,(double *)in_stack_fffffffffffff4f8);
      poplar::show_stat<double>
                ((ostream *)in_stack_fffffffffffff510,in_stack_fffffffffffff508,
                 (char *)in_stack_fffffffffffff500,(double *)in_stack_fffffffffffff4f8);
      poplar::show_stat<unsigned_long>
                ((ostream *)in_stack_fffffffffffff510,in_stack_fffffffffffff508,
                 (char *)in_stack_fffffffffffff500,(unsigned_long *)in_stack_fffffffffffff4f8);
      poplar::show_stat<unsigned_long>
                ((ostream *)in_stack_fffffffffffff510,in_stack_fffffffffffff508,
                 (char *)in_stack_fffffffffffff500,(unsigned_long *)in_stack_fffffffffffff4f8);
      if ((local_12a & 1) != 0) {
        poplar::show_member((ostream *)in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,
                            (char *)0x1b1c43);
        std::
        unique_ptr<poplar::map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>,_std::default_delete<poplar::map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>_>_>
        ::operator->((unique_ptr<poplar::map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>,_std::default_delete<poplar::map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>_>_>
                      *)0x1b1c52);
        poplar::
        map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
        ::show_stats((map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
                      *)CONCAT17(in_stack_fffffffffffff577,
                                 CONCAT16(in_stack_fffffffffffff576,in_stack_fffffffffffff570)),
                     in_stack_fffffffffffff568,iVar21);
      }
      local_4 = 0;
      local_3b4 = 1;
      std::__cxx11::string::~string(local_940);
    }
  }
LAB_001b1cf6:
  std::
  shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~shared_ptr((shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)0x1b1d03);
  std::
  shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~shared_ptr((shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)0x1b1d10);
LAB_001b1d2e:
  std::
  unique_ptr<poplar::map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>,_std::default_delete<poplar::map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>_>_>
  ::~unique_ptr((unique_ptr<poplar::map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>,_std::default_delete<poplar::map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>_>_>
                 *)in_stack_fffffffffffff500);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_30);
  return local_4;
}

Assistant:

int bench(const cmdline::parser& p) {
    auto key_fn = p.get<std::string>("key_fn");
    auto query_fn = p.get<std::string>("query_fn");
    auto capa_bits = p.get<uint32_t>("capa_bits");
    auto lambda = p.get<uint64_t>("lambda");
    auto runs = p.get<int>("runs");
    auto detail = p.get<bool>("detail");

    uint64_t num_keys = 0, num_queries = 0;
    uint64_t ok = 0, ng = 0;
    uint64_t process_size = get_process_size();

    double insert_us_per_key = 0.0, search_us_per_query = 0.0;
    double best_insert_us_per_key = 0.0, best_search_us_per_query = 0.0;

    auto map = std::make_unique<Map>(capa_bits, lambda);
    {
        std::ifstream ifs{key_fn};
        if (!ifs) {
            std::cerr << "error: failed to open " << key_fn << std::endl;
            return 1;
        }

        std::string key;
        key.reserve(1024);

        while (std::getline(ifs, key)) {
            *map->update(key) = 1;
            ++num_keys;
        }
        process_size = get_process_size() - process_size;
    }

    std::shared_ptr<std::vector<std::string>> keys;
    std::shared_ptr<std::vector<std::string>> queries;

    {
        std::ifstream ifs{key_fn};
        if (!ifs) {
            std::cerr << "Error: failed to open " << key_fn << std::endl;
            return 1;
        }

        keys = std::make_shared<std::vector<std::string>>();
        keys->reserve(num_keys);

        for (std::string line; std::getline(ifs, line);) {
            keys->push_back(line);
        }
    }

    if (query_fn != "-") {
        std::ifstream ifs{query_fn};
        if (!ifs) {
            std::cerr << "Error: failed to open " << query_fn << std::endl;
            return 1;
        }

        queries = std::make_shared<std::vector<std::string>>();

        for (std::string line; std::getline(ifs, line);) {
            queries->push_back(line);
        }
        queries->shrink_to_fit();
    } else {
        queries = keys;
    }

    {
        std::vector<double> insert_times(runs);
        std::vector<double> search_times(runs);

        for (int i = 0; i < runs; ++i) {
            auto map = std::make_unique<Map>(capa_bits, lambda);

            // insertion
            {
                timer t;
                for (const std::string& key : *keys) {
                    *map->update(key) = 1;
                }
                insert_times[i] = t.get<std::micro>() / keys->size();
            }

            // retrieval
            size_t _ok = 0, _ng = 0;
            {
                timer t;
                for (const std::string& query : *queries) {
                    auto ptr = map->find(query);
                    if (ptr != nullptr and *ptr == 1) {
                        ++_ok;
                    } else {
                        ++_ng;
                    }
                }
                search_times[i] = t.get<std::micro>() / queries->size();
            }

            if (i != 0) {
                if ((ok != _ok) or (ng != _ng)) {
                    std::cerr << "critical error for search results" << std::endl;
                    return 1;
                }
            }

            ok = _ok;
            ng = _ng;
        }

        num_keys = keys->size();
        num_queries = queries->size();
        insert_us_per_key = get_average(insert_times);
        best_insert_us_per_key = get_min(insert_times);
        search_us_per_query = get_average(search_times);
        best_search_us_per_query = get_min(search_times);
    }

    std::ostream& out = std::cout;
    auto indent = get_indent(0);

    show_stat(out, indent, "map_name", short_realname<Map>());
    show_stat(out, indent, "key_fn", key_fn);
    show_stat(out, indent, "query_fn", query_fn);
    show_stat(out, indent, "init_capa_bits", capa_bits);

    show_stat(out, indent, "rss_bytes", process_size);
    show_stat(out, indent, "rss_MiB", process_size / (1024.0 * 1024.0));

    show_stat(out, indent, "num_keys", num_keys);
    show_stat(out, indent, "num_queries", num_queries);

    show_stat(out, indent, "runs", runs);
    show_stat(out, indent, "insert_us_per_key", insert_us_per_key);
    show_stat(out, indent, "best_insert_us_per_key", best_insert_us_per_key);
    show_stat(out, indent, "search_us_per_query", search_us_per_query);
    show_stat(out, indent, "best_search_us_per_query", best_search_us_per_query);

    show_stat(out, indent, "ok", ok);
    show_stat(out, indent, "ng", ng);

    if (detail) {
        show_member(out, indent, "map");
        map->show_stats(out, 1);
    }

    return 0;
}